

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csat_apis.c
# Opt level: O3

void ABC_TargetResFree(CSAT_Target_ResultT *p)

{
  int iVar1;
  char **__ptr;
  long lVar2;
  
  if (p == (CSAT_Target_ResultT *)0x0) {
    return;
  }
  __ptr = p->names;
  if (__ptr != (char **)0x0) {
    iVar1 = p->no_sig;
    if (0 < iVar1) {
      lVar2 = 0;
      do {
        if (p->names[lVar2] != (char *)0x0) {
          free(p->names[lVar2]);
          p->names[lVar2] = (char *)0x0;
          iVar1 = p->no_sig;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < iVar1);
      __ptr = p->names;
      if (__ptr == (char **)0x0) goto LAB_004ff7f2;
    }
    free(__ptr);
    p->names = (char **)0x0;
  }
LAB_004ff7f2:
  if (p->values != (int *)0x0) {
    free(p->values);
  }
  free(p);
  return;
}

Assistant:

void ABC_TargetResFree( CSAT_Target_ResultT * p )
{
    if ( p == NULL )
        return;
    if( p->names )
    {
        int i = 0;
        for ( i = 0; i < p->no_sig; i++ )
        {
            ABC_FREE(p->names[i]);
        }
    }
    ABC_FREE( p->names );
    ABC_FREE( p->values );
    ABC_FREE( p );
}